

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O3

void __thiscall Scs::Client::Client(Client *this,ClientParams *params)

{
  char *pcVar1;
  size_t sVar2;
  
  (this->super_IClient)._vptr_IClient = (_func_int **)&PTR__Client_00191888;
  memset(&this->m_socket,0,0x98);
  pcVar1 = (params->port)._M_str;
  sVar2 = (params->port)._M_len;
  (this->m_port)._M_dataplus._M_p = (pointer)&(this->m_port).field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_port,pcVar1,
             pcVar1 + sVar2);
  pcVar1 = (params->address)._M_str;
  sVar2 = (params->address)._M_len;
  (this->m_address)._M_dataplus._M_p = (pointer)&(this->m_address).field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_address,
             pcVar1,pcVar1 + sVar2);
  this->m_timeoutMs = (long)(params->timeoutSeconds * 1000.0);
  (this->m_status)._M_i = Initial;
  (this->m_error)._M_base._M_i = false;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                       *)&this->m_sendQueue,0);
  (this->m_sendQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_sendQueue).m_bytesSent = 0;
  *(undefined8 *)((long)&(this->m_sendQueue).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_sendQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_sendQueue).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_sendQueue).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

Client::Client(const ClientParams & params) :
	m_port(params.port),
	m_address(params.address),
	m_timeoutMs(static_cast<long long>(params.timeoutSeconds * 1000.0))
{
}